

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O3

CURLcode base64_encode(char *table64,char *inputbuff,size_t insize,char **outptr,size_t *outlen)

{
  uint uVar1;
  char *pcVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  CURLcode CVar7;
  char *pcVar8;
  long lVar9;
  byte bVar10;
  uint uVar11;
  char *format;
  char *buffer;
  uchar ibuf [3];
  char *in_stack_ffffffffffffffa8;
  byte local_43 [3];
  char **local_40;
  size_t *local_38;
  
  *outptr = (char *)0x0;
  *outlen = 0;
  if (insize == 0) {
    insize = strlen(inputbuff);
  }
  pcVar8 = (char *)(*Curl_cmalloc)((insize * 4) / 3 + 4);
  if (pcVar8 == (char *)0x0) {
    CVar7 = CURLE_OUT_OF_MEMORY;
  }
  else {
    buffer = pcVar8;
    local_40 = outptr;
    local_38 = outlen;
    if (insize != 0) {
      pcVar2 = table64 + 0x40;
      do {
        lVar9 = 0;
        iVar6 = 0;
        do {
          if (insize == 0) {
            bVar10 = 0;
            insize = 0;
          }
          else {
            iVar6 = iVar6 + 1;
            bVar10 = *inputbuff;
            inputbuff = (char *)((byte *)inputbuff + 1);
            insize = insize - 1;
          }
          local_43[lVar9] = bVar10;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
        bVar10 = local_43[0] >> 2;
        uVar11 = (uint)(local_43[1] >> 4) | (local_43[0] & 3) << 4;
        uVar1 = (uint)(local_43[2] >> 6) + (local_43[1] & 0xf) * 4;
        if (iVar6 == 2) {
          cVar3 = table64[bVar10];
          cVar4 = table64[uVar11];
          cVar5 = table64[uVar1];
          format = "%c%c%c%s";
          in_stack_ffffffffffffffa8 = pcVar2;
LAB_00542031:
          iVar6 = curl_msnprintf(buffer,5,format,(ulong)(uint)(int)cVar3,(ulong)(uint)(int)cVar4,
                                 (ulong)(uint)(int)cVar5,in_stack_ffffffffffffffa8);
        }
        else {
          if (iVar6 != 1) {
            cVar3 = table64[bVar10];
            cVar4 = table64[uVar11];
            cVar5 = table64[uVar1];
            format = "%c%c%c%c";
            in_stack_ffffffffffffffa8 =
                 (char *)CONCAT44((int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                                  (int)table64[local_43[2] & 0x3f]);
            goto LAB_00542031;
          }
          in_stack_ffffffffffffffa8 = pcVar2;
          iVar6 = curl_msnprintf(buffer,5,"%c%c%s%s",(ulong)(uint)(int)table64[bVar10],
                                 (ulong)(uint)(int)table64[uVar11],pcVar2,pcVar2);
        }
        buffer = buffer + iVar6;
      } while (insize != 0);
    }
    *buffer = '\0';
    *local_40 = pcVar8;
    *local_38 = (long)buffer - (long)pcVar8;
    CVar7 = CURLE_OK;
  }
  return CVar7;
}

Assistant:

static CURLcode base64_encode(const char *table64,
                              const char *inputbuff, size_t insize,
                              char **outptr, size_t *outlen)
{
  unsigned char ibuf[3];
  unsigned char obuf[4];
  int i;
  int inputparts;
  char *output;
  char *base64data;
  const char *indata = inputbuff;
  const char *padstr = &table64[64];    /* Point to padding string. */

  *outptr = NULL;
  *outlen = 0;

  if(!insize)
    insize = strlen(indata);

#if SIZEOF_SIZE_T == 4
  if(insize > UINT_MAX/4)
    return CURLE_OUT_OF_MEMORY;
#endif

  base64data = output = malloc(insize * 4 / 3 + 4);
  if(!output)
    return CURLE_OUT_OF_MEMORY;

  while(insize > 0) {
    for(i = inputparts = 0; i < 3; i++) {
      if(insize > 0) {
        inputparts++;
        ibuf[i] = (unsigned char) *indata;
        indata++;
        insize--;
      }
      else
        ibuf[i] = 0;
    }

    obuf[0] = (unsigned char)  ((ibuf[0] & 0xFC) >> 2);
    obuf[1] = (unsigned char) (((ibuf[0] & 0x03) << 4) | \
                               ((ibuf[1] & 0xF0) >> 4));
    obuf[2] = (unsigned char) (((ibuf[1] & 0x0F) << 2) | \
                               ((ibuf[2] & 0xC0) >> 6));
    obuf[3] = (unsigned char)   (ibuf[2] & 0x3F);

    switch(inputparts) {
    case 1: /* only one byte read */
      i = msnprintf(output, 5, "%c%c%s%s",
                    table64[obuf[0]],
                    table64[obuf[1]],
                    padstr,
                    padstr);
      break;

    case 2: /* two bytes read */
      i = msnprintf(output, 5, "%c%c%c%s",
                    table64[obuf[0]],
                    table64[obuf[1]],
                    table64[obuf[2]],
                    padstr);
      break;

    default:
      i = msnprintf(output, 5, "%c%c%c%c",
                    table64[obuf[0]],
                    table64[obuf[1]],
                    table64[obuf[2]],
                    table64[obuf[3]]);
      break;
    }
    output += i;
  }

  /* Zero terminate */
  *output = '\0';

  /* Return the pointer to the new data (allocated memory) */
  *outptr = base64data;

  /* Return the length of the new data */
  *outlen = output - base64data;

  return CURLE_OK;
}